

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceStatement
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  ServiceOptions *options;
  MethodDescriptorProto *method;
  LocationRecorder location;
  
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = LookingAt(this,"option");
    if (bVar1) {
      LocationRecorder::LocationRecorder(&location,service_location,3);
      options = ServiceDescriptorProto::_internal_mutable_options(service);
      bVar2 = ParseOption(this,&options->super_Message,&location,containing_file,OPTION_STATEMENT);
    }
    else {
      LocationRecorder::LocationRecorder
                (&location,service_location,2,
                 (service->method_).super_RepeatedPtrFieldBase.current_size_);
      method = RepeatedPtrField<google::protobuf::MethodDescriptorProto>::Add(&service->method_);
      bVar2 = ParseServiceMethod(this,method,&location,containing_file);
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseServiceStatement(ServiceDescriptorProto* service,
                                   const LocationRecorder& service_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kOptionsFieldNumber);
    return ParseOption(service->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kMethodFieldNumber,
                              service->method_size());
    return ParseServiceMethod(service->add_method(), location, containing_file);
  }
}